

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.h
# Opt level: O2

Name __thiscall wasm::TranslateToFuzzReader::makeLabel(TranslateToFuzzReader *this)

{
  uint __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  string_view local_28;
  allocator<char> local_11;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"label$",&local_11);
  __val = this->funcContext->labelIndex;
  this->funcContext->labelIndex = __val + 1;
  std::__cxx11::to_string(&local_48,__val);
  std::operator+(&local_88,&local_68,&local_48);
  IString::IString((IString *)&local_28,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return (IString)(IString)local_28;
}

Assistant:

Name makeLabel() {
    return std::string("label$") + std::to_string(funcContext->labelIndex++);
  }